

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O3

void __thiscall
t_go_generator::parse_go_tags
          (t_go_generator *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *tags,string *in)

{
  char *pcVar1;
  mapped_type *pmVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  string value;
  string key;
  undefined1 *local_70;
  char *local_68;
  undefined1 local_60 [16];
  key_type local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70 = local_60;
  local_68 = (char *)0x0;
  local_60[0] = 0;
  if (0 < (long)in->_M_string_length) {
    pcVar1 = (in->_M_dataplus)._M_p;
    lVar5 = 0;
    lVar3 = 0;
    pcVar4 = pcVar1;
    do {
      if (lVar5 == 0 && lVar3 == 0) {
        if (*pcVar1 == ' ') {
LAB_001fb53d:
          lVar5 = 2;
          if (pcVar1[lVar3] == ' ') goto LAB_001fb57f;
        }
LAB_001fb549:
        if (pcVar1[lVar3] == ':') {
          lVar3 = lVar3 + 1;
          pcVar4 = pcVar4 + 1;
          lVar5 = 1;
        }
        else {
          std::__cxx11::string::push_back((char)&local_50);
          lVar5 = 0;
        }
      }
      else {
        if (lVar5 == 0) goto LAB_001fb549;
        if (lVar5 != 1) goto LAB_001fb53d;
        if (pcVar1[lVar3] == '\"') {
          pmVar2 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](tags,&local_50);
          std::__cxx11::string::_M_assign((string *)pmVar2);
          std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x378967);
          lVar5 = 2;
          std::__cxx11::string::_M_assign((string *)&local_50);
        }
        else {
          lVar5 = 1;
          std::__cxx11::string::push_back((char)&local_70);
        }
      }
LAB_001fb57f:
      pcVar4 = pcVar4 + 1;
      lVar3 = lVar3 + 1;
      pcVar1 = (in->_M_dataplus)._M_p;
    } while (pcVar4 < pcVar1 + in->_M_string_length);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_go_generator::parse_go_tags(map<string,string>* tags, const string in) {
  string key;
  string value;

  size_t mode=0; // 0/1/2 for key/value/whitespace
  size_t index=0;
  for (auto it=in.begin(); it<in.end(); ++it, ++index) {
      // Normally we start in key mode because the IDL is expected to be in
      // (go.tag="key:\"value\"") format, but if there is leading whitespace
      // we need to start in whitespace mode.
      if (index==0 && mode==0 && in[index]==' ') {
        mode=2;
      }

      if (mode==2) {
          if (in[index]==' ') {
              continue;
          }
          mode=0;
      }

      if (mode==0) {
          if (in[index]==':') {
              mode=1;
              index++;
              it++;
              continue;
          }
          key+=in[index];
      } else if (mode==1) {
          if (in[index]=='"') {
              (*tags)[key]=value;
              key=value="";
              mode=2;
              continue;
          }
          value+=in[index];
      }
  }
}